

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void attract_tick(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  int idam;
  CHAR_DATA *ch_00;
  
  if ((1 < ch->in_room->area->sky) && ((ch->in_room->room_flags[0] & 8) == 0)) {
    act("Your skin tingles briefly, and a bolt arcs down from the dark skies above!",ch,(void *)0x0,
        ch,3);
    act("The skies light up as lightning arcs like quicksilver towards $N!",ch,(void *)0x0,ch,0);
    ch_00 = af->owner;
    if (af->owner == (CHAR_DATA *)0x0) {
      af->owner = ch;
      ch_00 = ch;
    }
    idam = dice((int)af->level,4);
    damage_new(ch_00,ch,idam,(int)gsn_attract,6,true,false,0,1,"the lightning strike*");
    bVar1 = is_awake(ch);
    if (!bVar1) {
      ch->position = 8;
    }
  }
  return;
}

Assistant:

void attract_tick(CHAR_DATA *ch, AFFECT_DATA *af)
{
	if (ch->in_room->area->sky < WeatherCondition::Overcast || IS_SET(ch->in_room->room_flags, ROOM_INDOORS))
		return;

	act("Your skin tingles briefly, and a bolt arcs down from the dark skies above!", ch, nullptr, ch, TO_CHAR);
	act("The skies light up as lightning arcs like quicksilver towards $N!", ch, nullptr, ch, TO_ROOM);

	if (!af->owner)
		af->owner = ch;

	damage_new(af->owner, ch, dice(af->level, 4), gsn_attract, DAM_LIGHTNING, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the lightning strike*");

	if (!is_awake(ch))
		ch->position = POS_STANDING;
}